

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv_parser.h
# Opt level: O1

void __thiscall args_t::~args_t(args_t *this)

{
  long lVar1;
  
  if (0 < this->argc) {
    lVar1 = 0;
    do {
      if (this->argv[lVar1] != (char *)0x0) {
        operator_delete__(this->argv[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->argc);
  }
  if (this->argv != (char **)0x0) {
    operator_delete__(this->argv);
    return;
  }
  return;
}

Assistant:

~args_t() {
        for (int i = 0; i < argc; i++) {
            delete[] argv[i];
        }
        delete[] argv;
    }